

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionIsAnInitiator::RunImpl
          (TestsessionFixtureSessionIsAnInitiator *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_648 [8];
  sessionFixtureSessionIsAnInitiatorHelper fixtureHelper;
  bool ctorOk;
  TestsessionFixtureSessionIsAnInitiator *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  sessionFixtureSessionIsAnInitiatorHelper::sessionFixtureSessionIsAnInitiatorHelper
            ((sessionFixtureSessionIsAnInitiatorHelper *)local_648,&(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionIsAnInitiatorHelper>
            ((sessionFixtureSessionIsAnInitiatorHelper *)local_648,&(this->super_Test).m_details);
  sessionFixtureSessionIsAnInitiatorHelper::~sessionFixtureSessionIsAnInitiatorHelper
            ((sessionFixtureSessionIsAnInitiatorHelper *)local_648);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionIsAnInitiator) {
  createSession(1);
  CHECK(object->isInitiator());
}